

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

monst * shkcatch(obj *obj,xchar x,xchar y)

{
  uint uVar1;
  level *lev;
  char cVar2;
  boolean bVar3;
  int iVar4;
  monst *mtmp;
  char *pcVar5;
  char *pcVar6;
  obj *poVar7;
  char *pcVar8;
  
  lev = level;
  cVar2 = inside_shop(level,x,y);
  mtmp = shop_keeper(lev,cVar2);
  if (((((mtmp == (monst *)0x0) || (iVar4 = inhishop(mtmp), iVar4 == 0)) ||
       ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000)) ||
      ((u.ushops[0] == (char)mtmp[0x1b].meating &&
       (cVar2 = inside_shop(level,u.ux,u.uy), cVar2 != '\0')))) ||
     ((iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)x,(int)y), 2 < iVar4 ||
      ((mtmp->mx == x && (mtmp->my == y)))))) {
    return (monst *)0x0;
  }
  bVar3 = mnearto(mtmp,x,y,'\x01');
  if (bVar3 != '\0') {
    verbalize("Out of my way, scum!");
  }
  if ((viz_array[y][x] & 2U) == 0) goto LAB_0023003a;
  pcVar5 = Monnam(mtmp);
  if (mtmp->mx == x) {
    pcVar8 = " reaches over and";
    if (mtmp->my == y) {
      pcVar8 = "";
    }
  }
  else {
    pcVar8 = " reaches over and";
  }
  pcVar6 = xname(obj);
  pcVar6 = the(pcVar6);
  pline("%s nimbly%s catches %s.",pcVar5,pcVar8,pcVar6);
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0022fea8;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022fe4b;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022fe42;
    }
    else {
LAB_0022fe42:
      if (ublindf == (obj *)0x0) goto LAB_0022fef4;
LAB_0022fe4b:
      if (ublindf->oartifact != '\x1d') goto LAB_0022fef4;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_0022fea8;
LAB_0022fef4:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
        (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022ff41;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022ff3c;
      }
      else {
LAB_0022ff3c:
        if (ublindf != (obj *)0x0) {
LAB_0022ff41:
          if (ublindf->oartifact == '\x1d') goto LAB_0022ffd4;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00230030;
      }
LAB_0022ffd4:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41))))
      goto LAB_00230030;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
      map_invisible(x,y);
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 == '\0') goto LAB_0022fef4;
LAB_0022fea8:
    uVar1 = *(uint *)&mtmp->field_0x60;
    if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0022fee6;
      goto LAB_0022fef4;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_0022fef4;
LAB_0022fee6:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_0022fef4;
  }
LAB_00230030:
  (*windowprocs.win_delay)();
LAB_0023003a:
  subfrombill(obj,mtmp);
  mpickobj(mtmp,obj);
  return mtmp;
}

Assistant:

struct monst *shkcatch(struct obj *obj, xchar x, xchar y)
{
	struct monst *shkp;

	if (!(shkp = shop_keeper(level, inside_shop(level, x, y))) ||
	    !inhishop(shkp)) return 0;

	if (shkp->mcanmove && !shkp->msleeping &&
	    (*u.ushops != ESHK(shkp)->shoproom || !inside_shop(level, u.ux, u.uy)) &&
	    dist2(shkp->mx, shkp->my, x, y) < 3 &&
	    /* if it is the shk's pos, you hit and anger him */
	    (shkp->mx != x || shkp->my != y)) {
		if (mnearto(shkp, x, y, TRUE))
		    verbalize("Out of my way, scum!");
		if (cansee(x, y)) {
		    pline("%s nimbly%s catches %s.",
			  Monnam(shkp),
			  (x == shkp->mx && y == shkp->my) ? "" : " reaches over and",
			  the(xname(obj)));
		    if (!canspotmon(level, shkp))
			map_invisible(x, y);
		    win_delay_output();
		}
		subfrombill(obj, shkp);
		mpickobj(shkp, obj);
		return shkp;
	}
	return NULL;
}